

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O0

void __thiscall Epoll::Epoll(Epoll *this)

{
  int iVar1;
  allocator<epoll_event> local_11;
  Epoll *local_10;
  Epoll *this_local;
  
  local_10 = this;
  iVar1 = epoll_create1(0x80000);
  this->ep_epoll_fd = iVar1;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&this->ep_listen_fds);
  std::
  unordered_map<int,_Epoll::io_event,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>_>
  ::unordered_map(&this->ep_event_map);
  std::allocator<epoll_event>::allocator(&local_11);
  std::vector<epoll_event,_std::allocator<epoll_event>_>::vector(&this->ep_events,0x1000,&local_11);
  std::allocator<epoll_event>::~allocator(&local_11);
  if (0 < this->ep_epoll_fd) {
    return;
  }
  __assert_fail("ep_epoll_fd > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/epoll.cpp"
                ,0xf,"Epoll::Epoll()");
}

Assistant:

Epoll::Epoll() : ep_epoll_fd(epoll_create1(EPOLL_CLOEXEC)), ep_events(EVENTSNUM) {
    assert(ep_epoll_fd > 0);
}